

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void launch_test_thread<short>(vector<std::thread,_std::allocator<std::thread>_> *test_threads)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  vector<std::thread,_std::allocator<std::thread>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_fffffffffffffff0;
  
  if (launch_test_thread<short>(std::vector<std::thread,std::allocator<std::thread>>&)::max_threads
      == '\0') {
    iVar1 = __cxa_guard_acquire(&launch_test_thread<short>(std::vector<std::thread,std::allocator<std::thread>>&)
                                 ::max_threads);
    if (iVar1 != 0) {
      launch_test_thread<short>::max_threads = get_max_threads();
      in_stack_ffffffffffffffe8 =
           CONCAT13(launch_test_thread<short>::max_threads,(int3)in_stack_ffffffffffffffe8);
      __cxa_guard_release(&launch_test_thread<short>(std::vector<std::thread,std::allocator<std::thread>>&)
                           ::max_threads);
    }
  }
  uVar2 = (ulong)launch_test_thread<short>::max_threads;
  sVar3 = std::vector<std::thread,_std::allocator<std::thread>_>::size(in_RDI);
  if (uVar2 == sVar3) {
    wait_for_threads(in_stack_fffffffffffffff0);
    std::vector<std::thread,_std::allocator<std::thread>_>::clear
              ((vector<std::thread,_std::allocator<std::thread>_> *)0x10509b);
  }
  std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
            (in_stack_fffffffffffffff0,
             (_func_void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void launch_test_thread(std::vector<std::thread> &test_threads) {
    static uint8_t max_threads = get_max_threads();

    if (max_threads == test_threads.size()) {
        wait_for_threads(test_threads);
        test_threads.clear();
    }
    test_threads.emplace_back(run_test<_IntT>);
}